

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O1

void __thiscall Simulator::print(Simulator *this,PCode *code)

{
  ostream *poVar1;
  simulator_error *this_00;
  _Elt_pointer pSVar2;
  StackSymbol symbol;
  int local_8c;
  string local_88;
  Type local_68;
  int local_60;
  vector<int,_std::allocator<int>_> local_58;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_68 = pSVar2[-1].type_;
  local_60 = pSVar2[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,&pSVar2[-1].value_.int_array);
  local_40 = pSVar2[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&pSVar2[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  if (local_68 == kReal) {
    poVar1 = std::ostream::_M_insert<double>(local_40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else {
    if (local_68 != kInt) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_8c = this->eip_;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,anon_var_dwarf_b05a,anon_var_dwarf_b05a + 0x18);
      simulator_error::simulator_error(this_00,&local_8c,&local_88);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_60);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this->eip_ = this->eip_ + 1;
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::print(const PCode &code) {
    StackSymbol symbol = stack_.back();
    stack_.pop_back();

    if (symbol.type() == StackSymbol::Type::kInt) {
        std::cout << symbol.int_value() << std::endl;
    } else if (symbol.type() == StackSymbol::Type::kReal) {
        std::cout << symbol.real_value() << std::endl;
    } else {
        throw simulator_error(eip(), "不合法的输出参数");
    }

    inc_eip();
}